

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrackinglinesearch.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
backtrackingLineSearch::optimize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          backtrackingLineSearch *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  _func_double_vector<double,_std::allocator<double>_> *p_Var6;
  _func_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_> *p_Var7;
  vector<double,_std::allocator<double>_> vVar8;
  vector<double,_std::allocator<double>_> vVar9;
  vector<double,_std::allocator<double>_> vVar10;
  vector<double,_std::allocator<double>_> vVar11;
  vector<double,_std::allocator<double>_> vVar12;
  vector<double,_std::allocator<double>_> vVar13;
  vector<double,_std::allocator<double>_> vVar14;
  initializer_list<double> __l;
  ostream *poVar15;
  reference pvVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  __type _Var20;
  pointer in_stack_fffffffffffffc88;
  __type in_stack_fffffffffffffc90;
  pointer in_stack_fffffffffffffc98;
  vector<double,_std::allocator<double>_> local_190;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  vector<double,_std::allocator<double>_> local_148;
  vector<double,_std::allocator<double>_> local_130;
  vector<double,_std::allocator<double>_> local_118;
  allocator<double> local_f9;
  double local_f8;
  double local_f0;
  iterator local_e8;
  size_type local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> delta;
  double alpha_inc_;
  double alpha_dec_;
  double alpha_;
  uint count;
  backtrackingLineSearch *this_local;
  
  alpha_._4_4_ = 0;
  alpha_dec_ = this->alpha;
  dVar1 = this->alpha_dec;
  delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this->alpha_inc;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  if ((this->super_optimizer).verbose != 0) {
    poVar15 = std::operator<<((ostream *)&std::cout,"Initial SOLUTION : (");
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
    poVar15 = std::operator<<(poVar15,",");
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
    poVar15 = std::operator<<(poVar15,")");
    std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
    poVar15 = (ostream *)
              std::ostream::operator<<((ostream *)&(this->super_optimizer).logFile,*pvVar16);
    poVar15 = std::operator<<(poVar15," ");
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
    poVar15 = std::operator<<(poVar15," ");
    p_Var6 = this->f;
    std::vector<double,_std::allocator<double>_>::vector(&local_78,&this->x);
    vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffc90;
    vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = in_stack_fffffffffffffc88;
    vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffffffc98;
    dVar17 = (*p_Var6)(vVar8);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,dVar17);
    std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector(&local_78);
  }
  while (alpha_._4_4_ < 10) {
    p_Var7 = this->df;
    std::vector<double,_std::allocator<double>_>::vector(&local_c0,&this->x);
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)in_stack_fffffffffffffc90;
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = in_stack_fffffffffffffc88;
    vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffffffc98;
    (*p_Var7)(&local_a8,vVar9);
    utils::Delta(&local_90,&local_a8);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_50,&local_90);
    std::vector<double,_std::allocator<double>_>::~vector(&local_90);
    std::vector<double,_std::allocator<double>_>::~vector(&local_a8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_c0);
    while( true ) {
      p_Var6 = this->f;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
      dVar17 = *pvVar16;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_50,0);
      local_f8 = alpha_dec_ * *pvVar16 + dVar17;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
      dVar17 = *pvVar16;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_50,1);
      local_f0 = alpha_dec_ * *pvVar16 + dVar17;
      local_e8 = &local_f8;
      local_e0 = 2;
      std::allocator<double>::allocator(&local_f9);
      __l._M_len = local_e0;
      __l._M_array = local_e8;
      std::vector<double,_std::allocator<double>_>::vector(&local_d8,__l,&local_f9);
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffc90;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_fffffffffffffc88;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffc98;
      dVar18 = (*p_Var6)(vVar10);
      p_Var6 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_118,&this->x);
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffc90;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_fffffffffffffc88;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffc98;
      dVar19 = (*p_Var6)(vVar11);
      dVar17 = this->wolfe_para;
      p_Var7 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_148,&this->x);
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffc90;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_fffffffffffffc88;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffc98;
      (*p_Var7)(&local_130,vVar12);
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&local_130,0);
      dVar2 = *pvVar16;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_50,0);
      dVar3 = *pvVar16;
      p_Var7 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_178,&this->x);
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffc90;
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_fffffffffffffc88;
      vVar13.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffc98;
      (*p_Var7)(&local_160,vVar13);
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&local_160,1);
      dVar4 = *pvVar16;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_50,1);
      dVar5 = *pvVar16;
      std::vector<double,_std::allocator<double>_>::~vector(&local_160);
      std::vector<double,_std::allocator<double>_>::~vector(&local_178);
      std::vector<double,_std::allocator<double>_>::~vector(&local_130);
      std::vector<double,_std::allocator<double>_>::~vector(&local_148);
      std::vector<double,_std::allocator<double>_>::~vector(&local_118);
      std::vector<double,_std::allocator<double>_>::~vector(&local_d8);
      std::allocator<double>::~allocator(&local_f9);
      if (dVar18 <= dVar17 * (dVar2 * alpha_dec_ * dVar3 + dVar4 * alpha_dec_ * dVar5) + dVar19)
      break;
      alpha_dec_ = dVar1 * alpha_dec_;
      if ((this->super_optimizer).verbose != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Dec Alpha to: ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->alpha);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
    }
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_50,0);
    dVar17 = *pvVar16;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
    *pvVar16 = alpha_dec_ * dVar17 + *pvVar16;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_50,1);
    dVar17 = *pvVar16;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
    *pvVar16 = alpha_dec_ * dVar17 + *pvVar16;
    alpha_dec_ = (double)delta.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage * alpha_dec_;
    if ((this->super_optimizer).verbose != 0) {
      poVar15 = std::operator<<((ostream *)&std::cout,"########### NEW SOLUTION ########### : (");
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
      poVar15 = std::operator<<(poVar15,",");
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
      poVar15 = std::operator<<(poVar15,")");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,0);
      poVar15 = (ostream *)
                std::ostream::operator<<((ostream *)&(this->super_optimizer).logFile,*pvVar16);
      poVar15 = std::operator<<(poVar15," ");
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,1);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pvVar16);
      poVar15 = std::operator<<(poVar15," ");
      p_Var6 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_190,&this->x);
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)in_stack_fffffffffffffc90;
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_fffffffffffffc88;
      vVar14.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffc98;
      dVar17 = (*p_Var6)(vVar14);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,dVar17);
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      std::vector<double,_std::allocator<double>_>::~vector(&local_190);
    }
    in_stack_fffffffffffffc98 = (pointer)alpha_dec_;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_50,0);
    _Var20 = std::pow<double,int>((double)in_stack_fffffffffffffc98 * *pvVar16,2);
    in_stack_fffffffffffffc88 = (pointer)alpha_dec_;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_50,1);
    in_stack_fffffffffffffc90 = std::pow<double,int>((double)in_stack_fffffffffffffc88 * *pvVar16,2)
    ;
    dVar17 = sqrt(_Var20 + in_stack_fffffffffffffc90);
    if (dVar17 < this->tol) {
      alpha_._4_4_ = alpha_._4_4_ + 1;
    }
  }
  std::ofstream::close();
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,&this->x);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

vector<double> backtrackingLineSearch::optimize(){
    uint count=0;
    //local variable for that optimization problem
    double alpha_=alpha;
    double alpha_dec_=alpha_dec;
    double alpha_inc_=alpha_inc;
    vector<double> delta;
    if (verbose!=0){
        cout << "Initial SOLUTION : ("<< x[0] << ","<< x[1]<<")"<<endl;
        logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
    }
    while (count<10){
        delta=utils::Delta(df(x));
        while (f({x[0]+alpha_*delta[0],x[1]+alpha_*delta[1]})>f(x)+wolfe_para*(df(x)[0]*alpha_*delta[0]+df(x)[1]*alpha_*delta[1])){
            alpha_*=alpha_dec_;
            if(verbose!=0) cout<<"Dec Alpha to: "<<alpha<<endl;
        }
        x[0]+=alpha_*delta[0];
        x[1]+=alpha_*delta[1];
        alpha_*=alpha_inc_;
        if (verbose!=0){
            cout << "########### NEW SOLUTION ########### : ("<< x[0] << ","<< x[1]<<")"<<endl;
            logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
        }
        // terminaltion rule for the inner loop
        if(sqrt(pow(alpha_*delta[0],2)+pow(alpha_*delta[1],2))<tol)count++;
        }
    logFile.close();
    return x;
}